

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

uint32_t icu_63::CollationFastLatin::lookupUTF8
                   (uint16_t *table,UChar32 c,uint8_t *s8,int32_t *sIndex,int32_t sLength)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t t2;
  uint8_t t1;
  int32_t i2;
  int32_t sLength_local;
  int32_t *sIndex_local;
  uint8_t *s8_local;
  UChar32 c_local;
  uint16_t *table_local;
  
  if ((*sIndex + 1 < sLength) || (sLength < 0)) {
    uVar1 = s8[*sIndex];
    bVar2 = s8[*sIndex + 1];
    *sIndex = *sIndex + 2;
    if ((c == 0xe2) && (((uVar1 == 0x80 && (0x7f < bVar2)) && (bVar2 < 0xc0)))) {
      return (uint)table[(int)(bVar2 + 0x100)];
    }
    if ((c == 0xef) && (uVar1 == 0xbf)) {
      if (bVar2 == 0xbe) {
        return 3;
      }
      if (bVar2 == 0xbf) {
        return 0xfca8;
      }
    }
  }
  return 1;
}

Assistant:

uint32_t
CollationFastLatin::lookupUTF8(const uint16_t *table, UChar32 c,
                               const uint8_t *s8, int32_t &sIndex, int32_t sLength) {
    // The caller handled ASCII and valid/supported Latin.
    U_ASSERT(c > 0x7f);
    int32_t i2 = sIndex + 1;
    if(i2 < sLength || sLength < 0) {
        uint8_t t1 = s8[sIndex];
        uint8_t t2 = s8[i2];
        sIndex += 2;
        if(c == 0xe2 && t1 == 0x80 && 0x80 <= t2 && t2 <= 0xbf) {
            return table[(LATIN_LIMIT - 0x80) + t2];  // 2000..203F -> 0180..01BF
        } else if(c == 0xef && t1 == 0xbf) {
            if(t2 == 0xbe) {
                return MERGE_WEIGHT;  // U+FFFE
            } else if(t2 == 0xbf) {
                return MAX_SHORT | COMMON_SEC | LOWER_CASE | COMMON_TER;  // U+FFFF
            }
        }
    }
    return BAIL_OUT;
}